

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

StringView __thiscall
anon_unknown.dwarf_4f39de::ExpandedSpecialSubstitution::getBaseName
          (ExpandedSpecialSubstitution *this)

{
  long lVar1;
  StringView SVar2;
  
  lVar1 = (long)*(int *)&(this->super_Node).field_0xc;
  SVar2.Last = &DAT_001efcec + *(int *)(&DAT_001efcec + lVar1 * 4);
  SVar2.First = &DAT_001efd04 + *(int *)(&DAT_001efd04 + lVar1 * 4);
  return SVar2;
}

Assistant:

StringView getBaseName() const override {
    switch (SSK) {
    case SpecialSubKind::allocator:
      return StringView("allocator");
    case SpecialSubKind::basic_string:
      return StringView("basic_string");
    case SpecialSubKind::string:
      return StringView("basic_string");
    case SpecialSubKind::istream:
      return StringView("basic_istream");
    case SpecialSubKind::ostream:
      return StringView("basic_ostream");
    case SpecialSubKind::iostream:
      return StringView("basic_iostream");
    }
    LLVM_BUILTIN_UNREACHABLE;
  }